

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyFileImpl::~QNetworkReplyFileImpl(QNetworkReplyFileImpl *this)

{
  bool bVar1;
  QNetworkReplyFileImplPrivate *member;
  long lVar2;
  long lVar3;
  QFile *pQVar4;
  QObject *in_RDI;
  QNetworkReplyFileImplPrivate *d;
  ConnectionType c;
  QObject *obj;
  
  *(undefined ***)in_RDI = &PTR_metaObject_0049aef8;
  obj = in_RDI;
  member = d_func((QNetworkReplyFileImpl *)0x1e643a);
  c = (ConnectionType)((ulong)in_RDI >> 0x20);
  bVar1 = QPointer::operator_cast_to_bool((QPointer<QFile> *)0x1e6450);
  if (bVar1) {
    QPointer<QFile>::operator->((QPointer<QFile> *)0x1e6467);
    lVar2 = QObject::thread();
    lVar3 = QThread::currentThread();
    if (lVar2 == lVar3) {
      pQVar4 = QPointer::operator_cast_to_QFile_((QPointer<QFile> *)0x1e6497);
      if (pQVar4 != (QFile *)0x0) {
        (**(code **)(*(long *)pQVar4 + 0x20))();
      }
    }
    else {
      QPointer::operator_cast_to_QFile_((QPointer<QFile> *)0x1e64be);
      QMetaObject::invokeMethod<>(obj,(char *)member,c);
    }
  }
  QNetworkReply::~QNetworkReply((QNetworkReply *)0x1e64de);
  return;
}

Assistant:

QNetworkReplyFileImpl::~QNetworkReplyFileImpl()
{
    QNetworkReplyFileImplPrivate *d = (QNetworkReplyFileImplPrivate*) d_func();
    if (d->realFile) {
        if (d->realFile->thread() == QThread::currentThread())
            delete d->realFile;
        else
            QMetaObject::invokeMethod(d->realFile, "deleteLater", Qt::QueuedConnection);
    }
}